

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O0

Vec_Ptr_t * Vec_PtrAllocTruthTables(int nVars)

{
  void *pvVar1;
  Vec_Ptr_t *pVVar2;
  int local_50;
  uint local_48;
  int nWords;
  int k;
  int i;
  uint *pTruth;
  uint Masks [5];
  Vec_Ptr_t *p;
  int nVars_local;
  
  Masks[0] = 0xf0f0f0f0;
  Masks[1] = 0xff00ff00;
  Masks[2] = 0xffff0000;
  if (nVars < 6) {
    local_50 = 1;
  }
  else {
    local_50 = 1 << ((char)nVars - 5U & 0x1f);
  }
  pVVar2 = Vec_PtrAllocSimInfo(nVars,local_50);
  for (nWords = 0; nWords < nVars; nWords = nWords + 1) {
    pvVar1 = pVVar2->pArray[nWords];
    if (nWords < 5) {
      for (local_48 = 0; (int)local_48 < local_50; local_48 = local_48 + 1) {
        *(uint *)((long)pvVar1 + (long)(int)local_48 * 4) = Masks[(long)nWords + -2];
      }
    }
    else {
      for (local_48 = 0; (int)local_48 < local_50; local_48 = local_48 + 1) {
        if ((local_48 & 1 << ((char)nWords - 5U & 0x1f)) == 0) {
          *(undefined4 *)((long)pvVar1 + (long)(int)local_48 * 4) = 0;
        }
        else {
          *(undefined4 *)((long)pvVar1 + (long)(int)local_48 * 4) = 0xffffffff;
        }
      }
    }
  }
  return pVVar2;
}

Assistant:

static inline Vec_Ptr_t * Vec_PtrAllocTruthTables( int nVars )
{
    Vec_Ptr_t * p;
    unsigned Masks[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
    unsigned * pTruth;
    int i, k, nWords;
    nWords = (nVars <= 5 ? 1 : (1 << (nVars - 5)));
    p = Vec_PtrAllocSimInfo( nVars, nWords );
    for ( i = 0; i < nVars; i++ )
    {
        pTruth = (unsigned *)p->pArray[i];
        if ( i < 5 )
        {
            for ( k = 0; k < nWords; k++ )
                pTruth[k] = Masks[i];
        }
        else
        {
            for ( k = 0; k < nWords; k++ )
                if ( k & (1 << (i-5)) )
                    pTruth[k] = ~(unsigned)0;
                else
                    pTruth[k] = 0;
        }
    }
    return p;
}